

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O3

void __thiscall
PrimitiveDisplayer::drawRectangleOutline
          (PrimitiveDisplayer *this,GLfloat pixelSize,GLfloat width,GLfloat height,Colour *colour)

{
  GLfloat *pGVar1;
  undefined8 local_48;
  GLfloat vertices [8];
  
  glShadeModel(0x1d00);
  pGVar1 = Colour::getColour3fv(colour);
  glColor3fv(pGVar1);
  local_48 = 0;
  vertices[0] = width * pixelSize;
  vertices[1] = 0.0;
  vertices[3] = height * pixelSize;
  vertices[4] = 0.0;
  vertices[2] = vertices[0];
  vertices[5] = vertices[3];
  glEnableClientState(0x8074);
  glVertexPointer(2,0x1406,0,&local_48);
  glLineWidth(0x40800000);
  glDrawArrays(2,0,4);
  glDisableClientState(0x8074);
  return;
}

Assistant:

void PrimitiveDisplayer::drawRectangleOutline(GLfloat pixelSize, GLfloat width, GLfloat height, Colour* colour) {
    glShadeModel(GL_FLAT);
    glColor3fv(colour->getColour3fv());
    GLfloat vertices[8] = {
        0                   ,0
        ,pixelSize * width  ,0
        ,pixelSize * width  ,pixelSize * height
        ,0                  ,pixelSize * height
    };
	glEnableClientState(GL_VERTEX_ARRAY);
	glVertexPointer(2, GL_FLOAT, 0, vertices);
    glLineWidth(4);
	glDrawArrays(GL_LINE_LOOP, 0, 4);
	glDisableClientState(GL_VERTEX_ARRAY);
}